

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg_tools.cxx
# Opt level: O0

void permute_channels(char *in,char *out,int len,int channels,int bytespersample)

{
  int local_c4;
  int samples;
  int k;
  int j;
  int i;
  int permute [6] [6];
  int bytespersample_local;
  int channels_local;
  int len_local;
  char *out_local;
  char *in_local;
  
  permute[5][5] = bytespersample;
  memcpy(&j,&DAT_002dbbb0,0x90);
  if (channels < 7) {
    for (k = 0; k < (int)((long)((ulong)(uint)((int)((long)len / (long)channels) >> 0x1f) << 0x20 |
                                (long)len / (long)channels & 0xffffffffU) / (long)permute[5][5]);
        k = k + 1) {
      for (samples = 0; samples < channels; samples = samples + 1) {
        for (local_c4 = 0; local_c4 < permute[5][5]; local_c4 = local_c4 + 1) {
          out[k * permute[5][5] * channels +
              permute[5][5] * (&j)[(long)(channels + -1) * 6 + (long)samples] + local_c4] =
               in[k * permute[5][5] * channels + permute[5][5] * samples + local_c4];
        }
      }
    }
  }
  return;
}

Assistant:

static void
permute_channels(char *in, char *out, int len, int channels, int bytespersample)
{
	int permute[6][6] = {{0}, {0,1}, {0,2,1}, {0,1,2,3}, {0,1,2,3,4}, 
	{0,2,1,5,3,4}};
	int i,j,k;
	int samples = len/channels/bytespersample;

	/* Can't handle, don't try */
	if (channels > 6)
		return;

	for (i=0; i < samples; i++) {
		for (j=0; j < channels; j++) {
			for (k=0; k < bytespersample; k++) {
				out[i*bytespersample*channels + 
					bytespersample*permute[channels-1][j] + k] = 
					in[i*bytespersample*channels + bytespersample*j + k];
			}
		}
	}
}